

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int nni_cv_until(nni_cv *cv,nni_time until)

{
  int __errnum;
  char *pcVar1;
  timespec tStack_18;
  
  if (until == 0) {
    return 8;
  }
  if (until == 0xffffffffffffffff) {
    tStack_18.tv_nsec = 0x11998e;
    nni_plat_cv_wait(cv);
    return 0;
  }
  tStack_18.tv_sec = until / 1000;
  tStack_18.tv_nsec = (until % 1000) * 1000000;
  __errnum = pthread_cond_timedwait((pthread_cond_t *)cv,(pthread_mutex_t *)cv->mtx,&tStack_18);
  if (__errnum != 0) {
    if ((__errnum == 0x6e) || (__errnum == 0xb)) {
      __errnum = 5;
    }
    else {
      pcVar1 = strerror(__errnum);
      nni_panic("pthread_cond_timedwait: %s",pcVar1);
      __errnum = 3;
    }
  }
  return __errnum;
}

Assistant:

int
nni_cv_until(nni_cv *cv, nni_time until)
{
	// Some special cases for times.  Catching these here means that
	// platforms can assume a valid time is presented to them.
	if (until == NNI_TIME_NEVER) {
		nni_plat_cv_wait(cv);
		return (0);
	}
	if (until == NNI_TIME_ZERO) {
		return (NNG_EAGAIN);
	}

	return (nni_plat_cv_until(cv, until));
}